

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

void __thiscall OpenMD::SelectionSet::setAll(SelectionSet *this)

{
  pointer pOVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pOVar1 = (this->bitsets_).
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
    OpenMDBitSet::setBits
              ((OpenMDBitSet *)
               ((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> + lVar2),0,
               (ulong)*(uint *)((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_>
                               + lVar2 + 0x18) +
               (*(long *)((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> +
                         lVar2 + 0x10) -
               *(long *)((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> + lVar2
                        )) * 8,true);
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xf0);
  return;
}

Assistant:

void SelectionSet::setAll() {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].setAll();
  }